

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_dictionary_type_t ion_get_dictionary_type(ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  undefined1 local_34 [8];
  ion_dictionary_config_info_t config;
  ion_dictionary_type_t iStack_c;
  ion_err_t err;
  ion_dictionary_id_t id_local;
  
  config._28_4_ = id;
  iVar1 = ion_lookup_in_master_table(id,(ion_dictionary_config_info_t *)local_34);
  if (iVar1 == '\0') {
    iStack_c = config.value_size;
  }
  else {
    iStack_c = dictionary_type_error_t;
  }
  return iStack_c;
}

Assistant:

ion_dictionary_type_t
ion_get_dictionary_type(
	ion_dictionary_id_t id
) {
	ion_err_t						err;
	ion_dictionary_config_info_t	config;

	err = ion_lookup_in_master_table(id, &config);

	if (err_ok != err) {
		return dictionary_type_error_t;
	}

	return config.dictionary_type;
}